

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,bool forceFullPaths,
          bool forResponseFile,string *config)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Source_cmLocalGenerator_cxx:214:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Source_cmLocalGenerator_cxx:214:5)>
  __comp_00;
  pointer __last;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  char *pcVar10;
  pointer pbVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  string includePath;
  string flagVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string sysFwSearchFlagVar;
  string fwSearchFlagVar;
  string sysFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  ostringstream includeFlags;
  string local_318;
  OutputFormat local_2f4;
  char *local_2f0;
  cmGeneratorTarget *local_2e8;
  char *local_2e0;
  uint local_2d4;
  string local_2d0;
  string local_2b0;
  char *local_290;
  string *local_288;
  char *local_280;
  char *local_278;
  undefined1 local_270 [8];
  undefined1 auStack_268 [24];
  _Base_ptr local_250;
  size_t local_248;
  string local_240;
  string local_220;
  string local_200;
  string *local_1e0;
  cmOutputConverter *local_1d8;
  string *local_1d0;
  string *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,includeDirs);
    __last = local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar11 = local_1c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2d0._M_dataplus._M_p = (pointer)target;
    if (target != (cmGeneratorTarget *)0x0) {
      local_270 = (undefined1  [8])&local_2d0;
      auStack_268._0_8_ = config;
      auStack_268._8_8_ = lang;
      if (local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar6 = (long)local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_1c0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._16_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config = (string *)auStack_268._0_8_;
          __comp_00._M_comp.target = (cmGeneratorTarget **)local_270;
          __comp_00._M_comp.lang = (string *)auStack_268._8_8_;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar11,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,__comp_00);
        }
        else {
          __comp._M_comp.config = (string *)auStack_268._0_8_;
          __comp._M_comp.target = (cmGeneratorTarget **)local_270;
          __comp._M_comp.lang = (string *)auStack_268._8_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar11,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8._16_8_,local_1a8._8_8_,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"CMAKE_INCLUDE_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)(lang->_M_dataplus)._M_p);
    local_1d0 = cmMakefile::GetSafeDefinition(this->Makefile,&local_2d0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_2d0,0,(char *)local_2d0._M_string_length,0x4d6a03);
    std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)(lang->_M_dataplus)._M_p);
    local_2e0 = cmMakefile::GetDefinition(this->Makefile,&local_2d0);
    pcVar1 = this->Makefile;
    local_270 = (undefined1  [8])(auStack_268 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_278 = cmMakefile::GetDefinition(pcVar1,(string *)local_270);
    if (local_270 != (undefined1  [8])(auStack_268 + 8)) {
      operator_delete((void *)local_270,(ulong)(auStack_268._8_8_ + 1));
    }
    local_280 = " ";
    if (local_2e0 != (char *)0x0) {
      local_280 = local_2e0;
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,"CMAKE_INCLUDE_SYSTEM_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_200,(ulong)(lang->_M_dataplus)._M_p);
    if (local_2e0 == (char *)0x0) {
      local_2f0 = cmMakefile::GetDefinition(this->Makefile,&local_200);
    }
    else {
      local_2f0 = (char *)0x0;
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"CMAKE_","");
    local_2e8 = target;
    std::__cxx11::string::_M_append((char *)&local_220,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_220);
    pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_220);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"CMAKE_","");
    local_1e0 = __return_storage_ptr__;
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_240);
    local_288 = lang;
    local_290 = cmMakefile::GetDefinition(this->Makefile,&local_240);
    auStack_268._16_8_ = auStack_268;
    auStack_268._0_8_ = auStack_268._0_8_ & 0xffffffff00000000;
    auStack_268._8_8_ = 0;
    local_248 = 0;
    local_1c8 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_250 = (_Base_ptr)auStack_268._16_8_;
    if (local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_2f4 = (uint)forResponseFile * 2;
      bVar12 = local_290 == (char *)0x0;
      bVar13 = local_2e8 != (cmGeneratorTarget *)0x0;
      local_1d8 = &this->super_cmOutputConverter;
      bVar14 = local_2f0 != (char *)0x0;
      bVar4 = 0;
      local_2d4 = (uint)forceFullPaths;
      pbVar11 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
LAB_001ad7e6:
          if (!(bool)(local_2e0 != (char *)0x0 & bVar4)) {
            if (bVar14 && bVar13) {
              bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory
                                (local_2e8,pbVar11,config,local_288);
              pcVar10 = local_2f0;
              if (bVar5) {
                sVar8 = strlen(local_2f0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar10,sVar8);
                goto LAB_001ad85a;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(local_1d0->_M_dataplus)._M_p,
                       local_1d0->_M_string_length);
          }
LAB_001ad85a:
          (*this->_vptr_cmLocalGenerator[9])
                    (&local_318,this,pbVar11,(ulong)local_2f4,(ulong)local_2d4);
          if ((local_318._M_string_length != 0 && local_278 != (char *)0x0) &&
             (*local_318._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
          if (((local_278 != (char *)0x0) && (local_318._M_string_length != 0)) &&
             (*local_318._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          pcVar10 = local_280;
          sVar8 = strlen(local_280);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          bVar4 = 1;
        }
        else {
          pcVar1 = this->Makefile;
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"APPLE","");
          bVar5 = cmMakefile::IsOn(pcVar1,&local_318);
          if (bVar5) {
            bVar5 = cmSystemTools::IsPathToFramework(pbVar11);
          }
          else {
            bVar5 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if (bVar5 == false) goto LAB_001ad7e6;
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          pcVar2 = (pbVar11->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,pcVar2,pcVar2 + pbVar11->_M_string_length);
          std::__cxx11::string::append((char *)&local_318);
          cmsys::SystemTools::CollapseFullPath(&local_2b0,&local_318);
          std::__cxx11::string::operator=((string *)&local_318,(string *)&local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          pVar15 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_270,&local_318);
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (bVar12 || !bVar13) {
LAB_001ad72c:
              pcVar10 = pcVar7;
            }
            else {
              bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory
                                (local_2e8,pbVar11,config,local_288);
              pcVar10 = local_290;
              if (!bVar5) goto LAB_001ad72c;
            }
            sVar8 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar8);
            cmOutputConverter::ConvertToOutputFormat(&local_2b0,local_1d8,&local_318,local_2f4);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,
                                local_2b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != local_1c8);
    }
    __return_storage_ptr__ = local_1e0;
    std::__cxx11::stringbuf::str();
    if (((*local_280 != ' ') && (sVar3 = __return_storage_ptr__->_M_string_length, sVar3 != 0)) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar2[sVar3 - 1] == *local_280)) {
      pcVar2[sVar3 - 1] = ' ';
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  const std::vector<std::string>& includeDirs, cmGeneratorTarget* target,
  const std::string& lang, bool forceFullPaths, bool forResponseFile,
  const std::string& config)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  std::string const& includeFlag = this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (!sep) {
    sep = " ";
  } else {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
  }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag = this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string frameworkDir = i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << sysFwSearchFlag;
        } else {
          includeFlags << fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << sysIncludeFlag;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath =
      this->ConvertToIncludeReference(i, shellFormat, forceFullPaths);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return flags;
}